

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::global_cache_dir(Path *__return_storage_ptr__,localpathtype local)

{
  localpathtype lVar1;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  localpathtype local_14;
  Path *pPStack_10;
  localpathtype local_local;
  
  local_14 = local;
  pPStack_10 = __return_storage_ptr__;
  if (local == LOCALPATH_LOCAL) {
LAB_0011481b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"/var/local/cache",&local_39);
    Path(__return_storage_ptr__,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    if (local == LOCALPATH_DEFAULT) {
      lVar1 = get_global_dir_default();
      if (lVar1 == LOCALPATH_LOCAL) goto LAB_0011481b;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"/var/cache",&local_71);
    Path(__return_storage_ptr__,(string *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::global_cache_dir(localpathtype local)
{
#if defined(_PATHIE_UNIX)
 if (local == Path::LOCALPATH_LOCAL || (local == Path::LOCALPATH_DEFAULT && get_global_dir_default() == Path::LOCALPATH_LOCAL))
    return Path("/var/local/cache");
  else
    return Path("/var/cache");
#elif defined(_WIN32)
  return global_mutable_data_dir();
#else
#error Unsupported system.
#endif
}